

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_scrape_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  index_type iVar7;
  element_type *peVar8;
  tracker_request *ptVar9;
  undefined1 local_108 [8];
  shared_ptr<libtorrent::aux::request_callback> cb;
  int incomplete;
  int downloaded;
  int complete;
  int local_e0;
  seconds32 local_dc;
  error_code local_d8;
  int local_c8;
  seconds32 local_c4;
  int local_c0;
  seconds32 local_bc;
  error_code local_b8;
  int local_a4;
  seconds32 local_a0;
  int local_9c;
  object_type local_98;
  allocator local_81;
  string local_80 [32];
  error_code local_60;
  undefined1 local_50 [8];
  int local_48;
  duration<int,std::ratio<1l,1l>> local_44 [4];
  error_code local_40;
  undefined1 local_30 [8];
  uint32_t transaction;
  action_t action;
  udp_tracker_connection *this_local;
  span<const_char> buf_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (udp_tracker_connection *)buf.m_ptr;
  _transaction = this;
  timeout_handler::restart_read_timeout((timeout_handler *)this);
  iVar2 = read_int32<char_const>((span<const_char> *)&this_local);
  local_30[7] = (undefined1)iVar2;
  local_30._0_4_ = read_uint32<char_const>((span<const_char> *)&this_local);
  if (local_30._0_4_ == this->m_transaction_id) {
    if (local_30[7] == '\x03') {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_60,tracker_failure,(type *)0x0);
      pcVar5 = span<const_char>::data((span<const_char> *)&this_local);
      uVar6 = span<const_char>::size((span<const_char> *)&this_local);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_80,pcVar5,uVar6,&local_81);
      pcVar5 = (char *)::std::__cxx11::string::c_str();
      local_9c = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_98.__align,&local_9c);
      local_a4 = 0x1e;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_a0,&local_a4);
      fail(this,&local_60,bittorrent,pcVar5,(seconds32)local_98._0_4_,local_a0);
      ::std::__cxx11::string::~string(local_80);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
      buf_local.m_len._7_1_ = 1;
    }
    else if (local_30[7] == '\x02') {
      iVar7 = span<const_char>::size((span<const_char> *)&this_local);
      if (iVar7 < 0xc) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_d8,invalid_tracker_response_length,(type *)0x0);
        local_e0 = 0;
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)&local_dc,&local_e0);
        downloaded = 0x1e;
        ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<1l,1l>> *)&complete,&downloaded);
        fail(this,&local_d8,bittorrent,"",local_dc,(seconds32)complete);
        buf_local.m_len._7_1_ = 1;
      }
      else {
        uVar3 = read_int32<char_const>((span<const_char> *)&this_local);
        uVar4 = read_int32<char_const>((span<const_char> *)&this_local);
        cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = read_int32<char_const>((span<const_char> *)&this_local);
        tracker_connection::requester((tracker_connection *)local_108);
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_108);
        if (bVar1) {
          peVar8 = ::std::
                   __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_108);
          ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
          (*peVar8->_vptr_request_callback[3])
                    (peVar8,ptVar9,(ulong)uVar3,
                     (ulong)cb.
                            super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_,(ulong)uVar4,0xffffffff);
          (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])();
        }
        else {
          (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])();
        }
        buf_local.m_len._7_1_ = 1;
        ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::request_callback> *)local_108);
      }
    }
    else {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_b8,invalid_tracker_action,(type *)0x0);
      local_c0 = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_bc,&local_c0);
      local_c8 = 0x1e;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_c4,&local_c8);
      fail(this,&local_b8,bittorrent,"",local_bc,local_c4);
      buf_local.m_len._7_1_ = 1;
    }
  }
  else {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_40,invalid_tracker_transaction_id,(type *)0x0);
    local_48 = 0;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>(local_44,&local_48);
    local_50._0_4_ = 0x1e;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)(local_50 + 4),(int *)local_50);
    fail(this,&local_40,bittorrent,"",(seconds32)local_44,(seconds32)local_50._4_4_);
    buf_local.m_len._7_1_ = 0;
  }
  return (bool)(buf_local.m_len._7_1_ & 1);
}

Assistant:

bool udp_tracker_connection::on_scrape_response(span<char const> buf)
	{
		restart_read_timeout();
		auto const action = static_cast<action_t>(aux::read_int32(buf));
		std::uint32_t const transaction = aux::read_uint32(buf);

		if (transaction != m_transaction_id)
		{
			fail(error_code(errors::invalid_tracker_transaction_id), operation_t::bittorrent);
			return false;
		}

		if (action == action_t::error)
		{
			fail(error_code(errors::tracker_failure), operation_t::bittorrent
				, std::string(buf.data(), static_cast<std::size_t>(buf.size())).c_str());
			return true;
		}

		if (action != action_t::scrape)
		{
			fail(error_code(errors::invalid_tracker_action), operation_t::bittorrent);
			return true;
		}

		if (buf.size() < 12)
		{
			fail(error_code(errors::invalid_tracker_response_length), operation_t::bittorrent);
			return true;
		}

		int const complete = aux::read_int32(buf);
		int const downloaded = aux::read_int32(buf);
		int const incomplete = aux::read_int32(buf);

		std::shared_ptr<request_callback> cb = requester();
		if (!cb)
		{
			close();
			return true;
		}

		cb->tracker_scrape_response(tracker_req()
			, complete, incomplete, downloaded, -1);

		close();
		return true;
	}